

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cc
# Opt level: O2

void google::protobuf::File::ReadFileToStringOrDie(string *name,string *output)

{
  LogMessage *this;
  Nonnull<const_char_*> failure_msg;
  LogMessage local_28;
  
  failure_msg = (Nonnull<const_char_*>)0x0;
  ReadFileToString((File *)&local_28,name,output,false);
  if (local_28._0_8_ != 1) {
    failure_msg = absl::lts_20250127::status_internal::MakeCheckFailString
                            ((Nonnull<const_absl::Status_*>)&local_28,
                             "ReadFileToString(name, output) is OK");
  }
  absl::lts_20250127::Status::~Status((Status *)&local_28);
  if (local_28._0_8_ == 1) {
    return;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_28,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/testing/file.cc"
             ,0x4d,failure_msg);
  this = absl::lts_20250127::log_internal::LogMessage::operator<<
                   (&local_28,(char (*) [17])"Could not read: ");
  absl::lts_20250127::log_internal::LogMessage::operator<<(this,name);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_28);
}

Assistant:

void File::ReadFileToStringOrDie(const std::string& name, std::string* output) {
  ABSL_CHECK_OK(ReadFileToString(name, output)) << "Could not read: " << name;
}